

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStreamClient.cpp
# Opt level: O0

Output_GetVersion __thiscall ViconDataStreamSDK::CPP::Client::GetVersion(Client *this)

{
  element_type *this_00;
  Client *this_local;
  Output_GetVersion Output;
  
  this_00 = std::
            __shared_ptr_access<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this->m_pClientImpl);
  Core::VClient::GetVersion
            (this_00,(uint *)&this_local,(uint *)((long)&this_local + 4),&Output.Major,&Output.Minor
            );
  return _this_local;
}

Assistant:

CLASS_DECLSPEC
  Output_GetVersion Client::GetVersion() const
  {
    Output_GetVersion Output;
    m_pClientImpl->m_pCoreClient->GetVersion( Output.Major, 
                                              Output.Minor, 
                                              Output.Point,
                                              Output.Revision );

    return Output;
  }